

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportTable
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  allocator<char> local_112;
  allocator<char> local_111;
  undefined1 local_110 [8];
  undefined1 local_108 [24];
  uint64_t local_f0;
  uint64_t uStack_e8;
  bool local_e0;
  undefined4 uStack_df;
  undefined3 uStack_db;
  string_view field_name_local;
  string_view module_name_local;
  string local_b8;
  string local_98;
  Location loc;
  
  field_name_local._M_str = field_name._M_str;
  field_name_local._M_len = field_name._M_len;
  module_name_local._M_str = module_name._M_str;
  module_name_local._M_len = module_name._M_len;
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar2 = SharedValidator::OnTable(&this->validator_,&loc,elem_type,elem_limits);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    local_f0 = elem_limits->initial;
    uStack_e8 = elem_limits->max;
    local_e0 = elem_limits->has_max;
    local_108._8_4_ = Table;
    local_108._0_8_ = &PTR__ExternType_00242180;
    local_108._12_8_ = elem_type;
    uStack_df._0_1_ = elem_limits->is_shared;
    uStack_df._1_1_ = elem_limits->is_64;
    uStack_df._2_2_ = *(undefined2 *)&elem_limits->field_0x13;
    uStack_db = (undefined3)((uint)*(undefined4 *)&elem_limits->field_0x14 >> 8);
    if ((local_e0 & 1U) == 0) {
      uStack_e8 = 0xffffffff;
    }
    pMVar1 = this->module_;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_98,&module_name_local,&local_111);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_b8,&field_name_local,&local_112);
    TableType::Clone((TableType *)local_110);
    ImportType::ImportType
              ((ImportType *)&loc,&local_98,&local_b8,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_110);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&loc);
    ImportType::~ImportType((ImportType *)&loc);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_110 + 8))();
    }
    local_110 = (undefined1  [8])0x0;
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::push_back
              (&this->table_types_,(value_type *)local_108);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportTable(Index import_index,
                                         std::string_view module_name,
                                         std::string_view field_name,
                                         Index table_index,
                                         Type elem_type,
                                         const Limits* elem_limits) {
  CHECK_RESULT(validator_.OnTable(GetLocation(), elem_type, *elem_limits));
  TableType table_type{elem_type, *elem_limits};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), table_type.Clone())});
  table_types_.push_back(table_type);
  return Result::Ok;
}